

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::disconnectAll(QAbstractItemViewPrivate *this)

{
  long lVar1;
  bool bVar2;
  iterator pvVar3;
  iterator pvVar4;
  QEditorInfo *pQVar5;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QEditorInfo *info;
  add_const_t<QHash<QPersistentModelIndex,_QEditorInfo>_> *__range1_4;
  QAbstractItemDelegate *delegate_1;
  add_const_t<QMap<int,_QPointer<QAbstractItemDelegate>_>_> *__range1_3;
  QAbstractItemDelegate *delegate;
  add_const_t<QMap<int,_QPointer<QAbstractItemDelegate>_>_> *__range1_2;
  Connection *connection_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<QMetaObject::Connection,_4UL> *__range1_1;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_14UL> *__range1;
  QAbstractItemView *q;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator *in_stack_fffffffffffffe98;
  Object *in_stack_fffffffffffffea0;
  QAbstractItemModel *in_stack_fffffffffffffea8;
  QHash<QPersistentModelIndex,_QEditorInfo> *in_stack_fffffffffffffeb8;
  offset_in_QAbstractItemView_to_subr in_stack_fffffffffffffed0;
  offset_in_QItemSelectionModel_to_subr in_stack_fffffffffffffee0;
  QIndexEditorHash *signal;
  QAbstractItemDelegate *in_stack_ffffffffffffff08;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff10;
  Connection *local_88;
  Connection *local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_68 = std::array<QMetaObject::Connection,_14UL>::begin
                       ((array<QMetaObject::Connection,_14UL> *)0x7fff13);
  pvVar3 = std::array<QMetaObject::Connection,_14UL>::end
                     ((array<QMetaObject::Connection,_14UL> *)0x7fff28);
  for (; local_68 != pvVar3; local_68 = local_68 + 1) {
    QObject::disconnect(local_68);
  }
  local_88 = std::array<QMetaObject::Connection,_4UL>::begin
                       ((array<QMetaObject::Connection,_4UL> *)0x7fffb9);
  pvVar4 = std::array<QMetaObject::Connection,_4UL>::end
                     ((array<QMetaObject::Connection,_4UL> *)0x7fffce);
  for (; local_88 != pvVar4; local_88 = local_88 + 1) {
    QObject::disconnect(local_88);
  }
  ::QPointer::operator_cast_to_QAbstractItemDelegate_((QPointer<QAbstractItemDelegate> *)0x80003e);
  disconnectDelegate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::begin
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)in_RDI);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::end
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)in_RDI);
  while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
        , bVar2) {
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator*
              ((const_iterator *)0x8000e0);
    ::QPointer::operator_cast_to_QAbstractItemDelegate_((QPointer<QAbstractItemDelegate> *)0x8000e8)
    ;
    disconnectDelegate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffea0);
  }
  QMap<int,_QPointer<QAbstractItemDelegate>_>::begin
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)in_RDI);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::end
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)in_RDI);
  while (bVar2 = ::operator!=((const_iterator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
        , bVar2) {
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator*
              ((const_iterator *)0x8001a6);
    ::QPointer::operator_cast_to_QAbstractItemDelegate_((QPointer<QAbstractItemDelegate> *)0x8001ae)
    ;
    disconnectDelegate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffea0);
  }
  if ((in_RDI->model != (QAbstractItemModel *)0x0) &&
     (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8001fb), bVar2))
  {
    in_stack_fffffffffffffea8 = in_RDI->model;
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x800221);
    QObject::disconnect<void(QObject::*)(QObject*),void(QObject::*)()>
              ((Object *)in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffed0);
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x800295);
  if (bVar2) {
    in_stack_fffffffffffffea0 = (Object *)&in_RDI->selectionModel;
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x8002b4);
    QObject::
    disconnect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
              ((Object *)in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (Object *)in_stack_fffffffffffffea0,in_stack_fffffffffffffed0);
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x800315);
    QObject::
    disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (Object *)in_stack_fffffffffffffea0,in_stack_fffffffffffffed0);
  }
  signal = &in_RDI->indexEditorHash;
  QHash<QPersistentModelIndex,_QEditorInfo>::begin(in_stack_fffffffffffffeb8);
  QHash<QPersistentModelIndex,_QEditorInfo>::end
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)in_stack_fffffffffffffea8);
  while (bVar2 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator!=
                           ((const_iterator *)in_stack_fffffffffffffea8,
                            (const_iterator *)in_stack_fffffffffffffea0), bVar2) {
    pQVar5 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator*
                       ((const_iterator *)0x800429);
    if (((pQVar5->isStatic & 1U) == 0) &&
       (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x800443), bVar2)) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x800453);
      QObject::disconnect<void(QObject::*)(QObject*),void(QAbstractItemView::*)(QObject*)>
                ((Object *)in_stack_fffffffffffffea8,(offset_in_QObject_to_subr)signal,
                 (Object *)in_stack_fffffffffffffea0,0);
    }
    QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator++((const_iterator *)in_RDI);
  }
  QObject::disconnect(&in_RDI->scollerConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::disconnectAll()
{
    Q_Q(QAbstractItemView);
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : scrollbarConnections)
      QObject::disconnect(connection);
    disconnectDelegate(itemDelegate);
    for (QAbstractItemDelegate *delegate : std::as_const(rowDelegates))
        disconnectDelegate(delegate);
    for (QAbstractItemDelegate *delegate : std::as_const(columnDelegates))
        disconnectDelegate(delegate);
    if (model && selectionModel) {
        QObject::disconnect(model, &QAbstractItemModel::destroyed,
                            selectionModel, &QItemSelectionModel::deleteLater);
    }
    if (selectionModel) {
        QObject::disconnect(selectionModel, &QItemSelectionModel::selectionChanged,
                            q, &QAbstractItemView::selectionChanged);
        QObject::disconnect(selectionModel, &QItemSelectionModel::currentChanged,
                            q, &QAbstractItemView::currentChanged);
    }
    for (const auto &info : std::as_const(indexEditorHash)) {
        if (!info.isStatic && info.widget)
            QObject::disconnect(info.widget, &QWidget::destroyed, q, &QAbstractItemView::editorDestroyed);
    }
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
    QObject::disconnect(scollerConnection);
#endif
}